

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters.cc
# Opt level: O2

void __thiscall xLearn::Model::serialize_w_v_b(Model *this,FILE *file)

{
  int iVar1;
  
  WriteDataToDisk(file,(char *)&this->param_num_w_,4);
  iVar1 = std::__cxx11::string::compare((char *)this);
  if (iVar1 != 0) {
    WriteDataToDisk(file,(char *)&this->param_num_v_,4);
  }
  WriteDataToDisk(file,(char *)this->param_w_,(ulong)this->param_num_w_ << 2);
  WriteDataToDisk(file,(char *)this->param_b_,(ulong)this->aux_size_ << 2);
  iVar1 = std::__cxx11::string::compare((char *)this);
  if (iVar1 != 0) {
    WriteDataToDisk(file,(char *)this->param_v_,(ulong)this->param_num_v_ << 2);
    return;
  }
  return;
}

Assistant:

void Model::serialize_w_v_b(FILE* file) {
  // Write size of w
  WriteDataToDisk(file, (char*)&param_num_w_, sizeof(param_num_w_));
  // Write size of v
  if (score_func_.compare("linear") != 0) {
    WriteDataToDisk(file, (char*)&param_num_v_, sizeof(param_num_v_));
  }
  // Write w
  WriteDataToDisk(file, (char*)param_w_, sizeof(real_t)*param_num_w_);
  // Write b
  WriteDataToDisk(file, (char*)param_b_, sizeof(real_t)*aux_size_);
  // Write v
  if (score_func_.compare("linear") != 0) {
    WriteDataToDisk(file, (char*)param_v_, sizeof(real_t)*param_num_v_);
  }
}